

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O3

member_t *
kiste::parse_class_member(member_t *__return_storage_ptr__,parse_context *ctx,string *line)

{
  ulong uVar1;
  long lVar2;
  parse_error *this;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> member_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> member_class_name;
  long *local_60;
  long local_58;
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30 [2];
  
  if (ctx->_class_curly_level == 0) {
    this = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(this,"Cannot add a member here, did you forget to call $class?");
  }
  else {
    uVar1 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6,6);
    if (uVar1 == 0xffffffffffffffff) {
      this = (parse_error *)__cxa_allocate_exception(0x10);
      parse_error::parse_error(this,"Could not find member class name");
    }
    else {
      uVar1 = std::__cxx11::string::find_first_of((char *)line,0x1090d6,uVar1);
      if (uVar1 != 0xffffffffffffffff) {
        std::__cxx11::string::substr((ulong)&local_40,(ulong)line);
        uVar1 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6,uVar1);
        if (uVar1 == 0xffffffffffffffff) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Could not find member name");
          *(undefined ***)prVar3 = &PTR__runtime_error_0010cd88;
          __cxa_throw(prVar3,&parse_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar1 = std::__cxx11::string::find_first_of((char *)line,0x1090d6,uVar1);
        if (uVar1 == 0xffffffffffffffff) {
          uVar1 = 0xffffffffffffffff;
          std::__cxx11::string::substr((ulong)&local_60,(ulong)line);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_60,(ulong)line);
        }
        lVar2 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6,uVar1);
        if (lVar2 == -1) {
          (__return_storage_ptr__->class_name)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->class_name).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,local_40,local_38 + (long)local_40);
          (__return_storage_ptr__->name)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->name).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->name,local_60,local_58 + (long)local_60);
          if (local_60 != local_50) {
            operator_delete(local_60,local_50[0] + 1);
          }
          if (local_40 != local_30) {
            operator_delete(local_40,local_30[0] + 1);
          }
          return __return_storage_ptr__;
        }
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"unexpected characters after member declaration");
        *(undefined ***)prVar3 = &PTR__runtime_error_0010cd88;
        __cxa_throw(prVar3,&parse_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this = (parse_error *)__cxa_allocate_exception(0x10);
      parse_error::parse_error(this,"Could not find member name");
    }
  }
  __cxa_throw(this,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto parse_class_member(const parse_context& ctx, const std::string& line) -> member_t
  {
    if (not ctx._class_curly_level)
    {
      throw parse_error("Cannot add a member here, did you forget to call $class?");
    }
    const auto classBegin = line.find_first_not_of(" \t", std::strlen("member"));
    if (classBegin == line.npos)
      throw parse_error("Could not find member class name");
    const auto classEnd = line.find_first_of(" \t", classBegin);
    if (classEnd == line.npos)
      throw parse_error("Could not find member name");

    const auto member_class_name = line.substr(classBegin, classEnd - classBegin);

    const auto nameBegin = line.find_first_not_of(" \t", classEnd);
    if (nameBegin == line.npos)
      throw parse_error("Could not find member name");
    const auto nameEnd = line.find_first_of(" \t", nameBegin);

    const auto member_name = (nameEnd == line.npos) ? line.substr(nameBegin)
                                                    : line.substr(nameBegin, nameEnd - nameBegin);

    if (line.find_first_not_of(" \t", nameEnd) != line.npos)
    {
      throw parse_error("unexpected characters after member declaration");
    }

    return {member_class_name, member_name};
  }